

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.h
# Opt level: O0

char * UnitTest::_unittest_fail(void)

{
  bool bVar1;
  char *local_10;
  
  if ((global_unit_test_object_[1] & 1) == 0) {
    if (_unittest_fail::str == (char *)0x0) {
      bVar1 = mayUseColor((ostream *)&std::cout);
      if (bVar1) {
        _unittest_fail::str = _unittest_fail::fail;
      }
      else {
        _unittest_fail::str = _unittest_fail()::fail;
      }
    }
    local_10 = _unittest_fail::str;
  }
  else {
    local_10 = "XFAIL: ";
  }
  return local_10;
}

Assistant:

static const char *_unittest_fail() {  // {{{1
  if (global_unit_test_object_.expect_failure) {
    return "XFAIL: ";
  }
  static const char *str = 0;
  if (str == 0) {
    if (mayUseColor(std::cout)) {
      static const char *fail = " \033[1;40;31mFAIL:\033[0m ";
      str = fail;
    } else {
      static const char *fail = " FAIL: ";
      str = fail;
    }
  }
  return str;
}